

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::resize_bilinear
               (tensor *dest,longlong dest_row_stride,longlong dest_channel_stride,tensor *src,
               longlong src_row_stride,longlong src_channel_stride)

{
  uint *puVar1;
  thread_pool_implementation *this;
  task_state_type *ptVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread_pool *ptVar6;
  unsigned_long uVar7;
  long lVar8;
  pthread_t id;
  long lVar9;
  code *pcVar10;
  uint64 uVar11;
  ostream *poVar12;
  fatal_error *pfVar13;
  long *plVar14;
  long i;
  long lVar15;
  long lVar16;
  long lVar17;
  ostringstream dlib_o_out;
  float *d;
  float *s;
  string local_240;
  long local_220;
  thread_pool *local_218;
  long local_210;
  long local_208;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2326:58)>
  *local_200;
  code *local_1f8;
  long local_1f0;
  long local_1e8;
  longlong local_1e0;
  longlong local_1d8;
  longlong local_1d0;
  longlong local_1c8;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2326:58)>
  local_1c0;
  anon_class_64_8_7869db34 local_1b8 [5];
  float *local_40;
  float *local_38;
  
  local_1e0 = src_channel_stride;
  local_1d8 = src_row_stride;
  local_1d0 = dest_channel_stride;
  local_1c8 = dest_row_stride;
  if (dest == src) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"\n\nError detected at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x90c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"is_same_object(dest, src)==false",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n",2);
    puVar1 = (uint *)((long)&local_1b8[0].src_row_stride + (long)local_1b8[0].s[-3]);
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  if (dest->m_n == src->m_n) {
    if (dest->m_k == src->m_k) {
      if ((dest->m_size != 0) && (src->m_size != 0)) {
        iVar5 = (*src->_vptr_tensor[2])(src);
        local_38 = (float *)CONCAT44(extraout_var,iVar5);
        iVar5 = (*dest->_vptr_tensor[3])(dest);
        local_40 = (float *)CONCAT44(extraout_var_00,iVar5);
        local_1b8[0].d = &local_40;
        local_1b8[0].src_channel_stride = &local_1e0;
        lVar16 = dest->m_n * dest->m_k;
        local_1b8[0].src_row_stride = &local_1d8;
        local_1b8[0].dest_channel_stride = &local_1d0;
        local_1b8[0].dest_row_stride = &local_1c8;
        local_1b8[0].s = &local_38;
        local_1b8[0].src = src;
        local_1b8[0].dest = dest;
        ptVar6 = default_thread_pool();
        local_200 = &local_1c0;
        local_1f8 = impl::
                    helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>
                    ::run;
        local_1f0 = 0;
        local_1c0.funct = local_1b8;
        uVar7 = thread_pool_implementation::num_threads_in_pool
                          ((ptVar6->impl).
                           super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (uVar7 == 0) {
          if (0 < lVar16) {
            lVar9 = 0;
            do {
              impl::
              helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>
              ::run(&local_1c0,lVar9);
              lVar9 = lVar9 + 1;
            } while (lVar16 - lVar9 != 0);
          }
        }
        else {
          uVar7 = thread_pool_implementation::num_threads_in_pool
                            ((ptVar6->impl).
                             super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          lVar8 = lVar16 / (long)(uVar7 << 3);
          lVar9 = 1;
          if (1 < lVar8) {
            lVar9 = lVar8;
          }
          if (0 < lVar16) {
            lVar8 = lVar9;
            lVar15 = 0;
            local_220 = lVar9;
            local_218 = ptVar6;
            local_210 = lVar16;
            do {
              local_1e8 = lVar15 + lVar9;
              lVar17 = lVar16;
              if (lVar8 < lVar16) {
                lVar17 = lVar8;
              }
              this = (ptVar6->impl).
                     super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
              if (local_1e8 < lVar16) {
                lVar16 = local_1e8;
              }
              local_240._M_dataplus._M_p = (pointer)&this->m;
              local_240._M_string_length = 0;
              local_240.field_2._M_allocated_capacity = 0;
              local_208 = lVar8;
              pthread_mutex_lock((pthread_mutex_t *)local_240._M_dataplus._M_p);
              id = pthread_self();
              lVar9 = thread_pool_implementation::find_empty_task_slot(this);
              if ((lVar9 == -1) &&
                 (bVar4 = thread_pool_implementation::is_worker_thread(this,id), bVar4)) {
                auto_mutex::unlock((auto_mutex *)&local_240);
                lVar8 = local_208;
                lVar16 = local_210;
                ptVar6 = local_218;
                lVar9 = local_220;
                do {
                  plVar14 = (long *)((long)&local_200->funct + local_1f0);
                  pcVar10 = local_1f8;
                  if (((ulong)local_1f8 & 1) != 0) {
                    pcVar10 = *(code **)(local_1f8 + *plVar14 + -1);
                  }
                  (*pcVar10)(plVar14,lVar15);
                  lVar15 = lVar15 + 1;
                } while (lVar17 != lVar15);
              }
              else {
                while (lVar9 == -1) {
                  pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                                    (pthread_mutex_t *)(this->task_done_signaler).associated_mutex);
                  lVar9 = thread_pool_implementation::find_empty_task_slot(this);
                }
                (this->tasks).array_elements[lVar9].thread_id = id;
                uVar11 = thread_pool_implementation::make_next_task_id(this,lVar9);
                ptVar2 = (this->tasks).array_elements;
                ptVar2[lVar9].task_id = uVar11;
                (*(code *)**ptVar2[lVar9].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
                puVar3 = (undefined8 *)
                         ptVar2[lVar9].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data;
                puVar3[1] = &local_200;
                *(undefined4 *)(puVar3 + 2) = 0;
                puVar3[3] = impl::
                            helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>_>
                            ::process_block;
                puVar3[4] = 0;
                *puVar3 = &PTR__mp_base_base_001fa638;
                ptVar2 = (this->tasks).array_elements;
                ptVar2[lVar9].arg1 = lVar15;
                ptVar2[lVar9].arg2 = lVar16;
                pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
                lVar9 = local_220;
                lVar8 = local_208;
                lVar16 = local_210;
                ptVar6 = local_218;
              }
              auto_mutex::unlock((auto_mutex *)&local_240);
              lVar8 = lVar8 + lVar9;
              lVar15 = local_1e8;
            } while (local_1e8 < lVar16);
          }
          thread_pool_implementation::wait_for_all_tasks
                    ((ptVar6->impl).
                     super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
      }
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"\n\nError detected at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x90e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,
               "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"dest.k() == src.k()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n",2);
    puVar1 = (uint *)((long)&local_1b8[0].src_row_stride + (long)local_1b8[0].s[-3]);
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_240);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"\n\nError detected at line ",0x19);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,0x90d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,
             "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
             ,0x65);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"dest.num_samples() == src.num_samples()",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,".\n",2);
  puVar1 = (uint *)((long)&local_1b8[0].src_row_stride + (long)local_1b8[0].s[-3]);
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\n",1);
  pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_240);
  __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
}

Assistant:

void resize_bilinear (
            tensor& dest,
            long long dest_row_stride,
            long long dest_channel_stride,
            const tensor& src,
            long long src_row_stride,
            long long src_channel_stride
        )
        {
            DLIB_CASSERT(is_same_object(dest, src)==false);
            DLIB_CASSERT(dest.num_samples() == src.num_samples());
            DLIB_CASSERT(dest.k() == src.k());

            if (dest.size() == 0 || src.size() == 0)
                return;

            const float* s = src.host();
            float* d = dest.host();

            parallel_for(0, dest.k()*dest.num_samples(), [&](long i)
            {
                auto simg = sub_image(s+i*src_channel_stride, src.nr(), src.nc(), src_row_stride);
                auto dimg = sub_image(d+i*dest_channel_stride, dest.nr(), dest.nc(), dest_row_stride);

                resize_image(simg, dimg);
            });
        }